

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t utf16_to_unicode(uint32_t *pwc,char *s,size_t n,wchar_t be)

{
  uint uVar1;
  char *utf16;
  ushort *puVar2;
  ushort uVar3;
  
  if (n == 0) {
    return L'\0';
  }
  if (n == 1) {
    *pwc = 0xfffd;
    return L'\xffffffff';
  }
  if (be == L'\0') {
    uVar3 = *(ushort *)s;
  }
  else {
    uVar3 = *(ushort *)s << 8 | *(ushort *)s >> 8;
  }
  uVar1 = (uint)uVar3;
  puVar2 = (ushort *)(s + 2);
  if ((uVar1 & 0xfc00) == 0xd800) {
    if (3 < n) {
      if (be == L'\0') {
        uVar3 = *puVar2;
      }
      else {
        uVar3 = *(ushort *)(s + 2) << 8 | *(ushort *)(s + 2) >> 8;
      }
      if ((uVar3 & 0xfc00) == 0xdc00) {
        uVar1 = uVar1 * 0x400 + (uint)uVar3 + 0xfca02400;
        puVar2 = (ushort *)(s + 4);
        goto LAB_003ebb2f;
      }
    }
    *pwc = 0xfffd;
    return L'\xfffffffe';
  }
LAB_003ebb2f:
  if (0x10ffff < uVar1 || (uVar1 & 0xfffff800) == 0xd800) {
    *pwc = 0xfffd;
    return (int)s - (int)puVar2;
  }
  *pwc = uVar1;
  return (int)puVar2 - (int)s;
}

Assistant:

static int
utf16_to_unicode(uint32_t *pwc, const char *s, size_t n, int be)
{
	const char *utf16 = s;
	unsigned uc;

	if (n == 0)
		return (0);
	if (n == 1) {
		/* set the Replacement Character instead. */
		*pwc = UNICODE_R_CHAR;
		return (-1);
	}

	if (be)
		uc = archive_be16dec(utf16);
	else
		uc = archive_le16dec(utf16);
	utf16 += 2;
		
	/* If this is a surrogate pair, assemble the full code point.*/
	if (IS_HIGH_SURROGATE_LA(uc)) {
		unsigned uc2;

		if (n >= 4) {
			if (be)
				uc2 = archive_be16dec(utf16);
			else
				uc2 = archive_le16dec(utf16);
		} else
			uc2 = 0;
		if (IS_LOW_SURROGATE_LA(uc2)) {
			uc = combine_surrogate_pair(uc, uc2);
			utf16 += 2;
		} else {
	 		/* Undescribed code point should be U+FFFD
		 	* (replacement character). */
			*pwc = UNICODE_R_CHAR;
			return (-2);
		}
	}

	/*
	 * Surrogate pair values(0xd800 through 0xdfff) are only
	 * used by UTF-16, so, after above calculation, the code
	 * must not be surrogate values, and Unicode has no codes
	 * larger than 0x10ffff. Thus, those are not legal Unicode
	 * values.
	 */
	if (IS_SURROGATE_PAIR_LA(uc) || uc > UNICODE_MAX) {
	 	/* Undescribed code point should be U+FFFD
	 	* (replacement character). */
		*pwc = UNICODE_R_CHAR;
		return (((int)(utf16 - s)) * -1);
	}
	*pwc = uc;
	return ((int)(utf16 - s));
}